

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBezierCurve.cpp
# Opt level: O1

int __thiscall
chrono::ChBezierCurveTracker::calcClosestPoint
          (ChBezierCurveTracker *this,ChVector<double> *loc,ChFrame<double> *tnb,double *curvature)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  ChVector<double> r;
  ChVector<double> rpp;
  ChVector<double> rp;
  ChMatrix33<double> A;
  ChVector<double> local_b8;
  ChVector<double> local_a0;
  ChVector<double> local_88;
  ChMatrix33<double> local_70;
  undefined1 extraout_var [56];
  
  local_b8.m_data[0] = 0.0;
  local_b8.m_data[1] = 0.0;
  local_b8.m_data[2] = 0.0;
  iVar2 = calcClosestPoint(this,loc,&local_b8);
  ChBezierCurve::evalD
            (&local_88,*(ChBezierCurve **)this,*(size_t *)(this + 0x10),*(double *)(this + 0x18));
  ChBezierCurve::evalDD
            (&local_a0,*(ChBezierCurve **)this,*(size_t *)(this + 0x10),*(double *)(this + 0x18));
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_88.m_data[0];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_88.m_data[1];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_a0.m_data[2];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_88.m_data[2];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_a0.m_data[0];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_a0.m_data[1];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_a0.m_data[1] * local_88.m_data[2];
  auVar31 = vfmsub231sd_fma(auVar29,auVar14,auVar6);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_a0.m_data[2] * local_88.m_data[0];
  auVar34 = vfmsub231sd_fma(auVar32,auVar20,auVar9);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_a0.m_data[0] * local_88.m_data[1];
  auVar37 = vfmsub231sd_fma(auVar35,auVar16,auVar12);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_88.m_data[1] * local_88.m_data[1];
  auVar6 = vfmadd231sd_fma(auVar3,auVar16,auVar16);
  auVar6 = vfmadd231sd_fma(auVar6,auVar20,auVar20);
  auVar30._0_8_ = auVar31._0_8_;
  auVar33._0_8_ = auVar34._0_8_;
  auVar36._0_8_ = auVar37._0_8_;
  if (auVar6._0_8_ < 0.0) {
    dVar4 = sqrt(auVar6._0_8_);
    auVar36._8_8_ = 0;
    auVar33._8_8_ = 0;
    auVar30._8_8_ = 0;
    auVar31 = auVar30;
    auVar34 = auVar33;
    auVar37 = auVar36;
  }
  else {
    auVar6 = vsqrtsd_avx(auVar6,auVar6);
    dVar4 = auVar6._0_8_;
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = auVar34._0_8_ * auVar34._0_8_;
  auVar6 = vfmadd231sd_fma(auVar7,auVar31,auVar31);
  auVar6 = vfmadd231sd_fma(auVar6,auVar37,auVar37);
  if (auVar6._0_8_ < 0.0) {
    auVar8._0_8_ = sqrt(auVar6._0_8_);
    auVar8._8_56_ = extraout_var;
    auVar6 = auVar8._0_16_;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = auVar36._0_8_;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = auVar33._0_8_;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = auVar30._0_8_;
  }
  else {
    auVar6 = vsqrtsd_avx(auVar6,auVar6);
  }
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_88.m_data[1];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_88.m_data[0];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_88.m_data[2];
  local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       1.0 / dVar4;
  local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_88.m_data[0] *
       local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_88.m_data[1] *
       local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_88.m_data[2] *
       local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar1._8_8_ = 0x7fffffffffffffff;
  auVar1._0_8_ = 0x7fffffffffffffff;
  auVar3 = vandpd_avx512vl(auVar6,auVar1);
  dVar5 = auVar6._0_8_;
  if (auVar3._0_8_ <= 1e-06) {
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar28._8_8_ = 0;
    auVar28._0_8_ =
         local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar31 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar28,auVar10);
    local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         auVar31._0_8_;
    local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] +
         local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
         -0.0;
    auVar19._8_8_ = 0;
    auVar19._0_8_ =
         local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
         -0.0;
    auVar6 = vfmadd231sd_fma(auVar19,auVar10,ZEXT816(0));
    local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         auVar6._0_8_;
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar22._8_8_ = 0;
    auVar22._0_8_ =
         local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
         local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar6 = vfmsub231sd_fma(auVar22,auVar11,auVar6);
    local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         auVar6._0_8_;
    auVar25._8_8_ = 0;
    auVar25._0_8_ =
         local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] *
         local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar6 = vfmsub231sd_fma(auVar25,auVar28,auVar31);
    local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         auVar6._0_8_;
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar21._8_8_ = 0;
    auVar21._0_8_ =
         local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar27._8_8_ = 0;
    auVar27._0_8_ =
         local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] *
         local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar6 = vfmsub231sd_fma(auVar27,auVar13,auVar21);
    local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         auVar6._0_8_;
  }
  else {
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_88.m_data[1] * auVar37._0_8_;
    auVar6 = vfmsub231sd_fma(auVar15,auVar34,auVar17);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = auVar31._0_8_ * local_88.m_data[2];
    auVar3 = vfmsub231sd_fma(auVar18,auVar37,auVar23);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = auVar34._0_8_ * local_88.m_data[0];
    auVar9 = vfmsub231sd_fma(auVar24,auVar31,auVar26);
    local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         1.0 / (dVar4 * dVar5);
    local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] *
         auVar6._0_8_;
    local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] *
         auVar3._0_8_;
    local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] *
         auVar9._0_8_;
    local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         1.0 / dVar5;
    local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         auVar31._0_8_ *
         local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         auVar34._0_8_ *
         local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         auVar37._0_8_ *
         local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  }
  ChFrame<double>::SetRot(tnb,&local_70);
  (tnb->coord).pos.m_data[0] = local_b8.m_data[0];
  (tnb->coord).pos.m_data[1] = local_b8.m_data[1];
  (tnb->coord).pos.m_data[2] = local_b8.m_data[2];
  *curvature = dVar5 / (dVar4 * dVar4 * dVar4);
  return iVar2;
}

Assistant:

int ChBezierCurveTracker::calcClosestPoint(const ChVector<>& loc, ChFrame<>& tnb, double& curvature) {
    // Find closest point to specified location
    ChVector<> r;
    int flag = calcClosestPoint(loc, r);

    // Find 1st and 2nd order derivative vectors at the closest point
    ChVector<> rp = m_path->evalD(m_curInterval, m_curParam);
    ChVector<> rpp = m_path->evalDD(m_curInterval, m_curParam);

    // Calculate TNB frame
    ChVector<> rp_rpp = Vcross(rp, rpp);
    double rp_norm = rp.Length();
    double rp_rpp_norm = rp_rpp.Length();

    ChVector<> T = rp / rp_norm;
    ChVector<> N;
    ChVector<> B;
    if (std::abs(rp_rpp_norm) > 1e-6) {
        N = Vcross(rp_rpp, rp) / (rp_norm * rp_rpp_norm);
        B = rp_rpp / rp_rpp_norm;
    } else {  // Zero curvature
        B = ChVector<>(0, 0, 1);
        N = Vcross(B, T);
        B = Vcross(T, N);
    }

    ChMatrix33<> A(T, N, B);

    tnb.SetRot(A);
    tnb.SetPos(r);


    // Calculate curvature
    curvature = rp_rpp_norm / (rp_norm * rp_norm * rp_norm);

    return flag;
}